

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O3

rbtree_node_base * eastl::RBTreeDecrement(rbtree_node_base *pNode)

{
  rbtree_node_base *prVar1;
  rbtree_node_base *prVar2;
  bool bVar3;
  
  if ((pNode->mpNodeParent->mpNodeParent == pNode) && (pNode->mColor == '\0')) {
    return pNode->mpNodeRight;
  }
  prVar1 = pNode->mpNodeLeft;
  if (pNode->mpNodeLeft == (rbtree_node_base *)0x0) {
    do {
      prVar2 = pNode->mpNodeParent;
      bVar3 = pNode == prVar2->mpNodeLeft;
      pNode = prVar2;
    } while (bVar3);
  }
  else {
    do {
      prVar2 = prVar1;
      prVar1 = prVar2->mpNodeRight;
    } while (prVar2->mpNodeRight != (this_type *)0x0);
  }
  return prVar2;
}

Assistant:

EASTL_API rbtree_node_base* RBTreeDecrement(const rbtree_node_base* pNode)
    {
        if((pNode->mpNodeParent->mpNodeParent == pNode) && (pNode->mColor == kRBTreeColorRed))
            return pNode->mpNodeRight;
        else if(pNode->mpNodeLeft)
        {
            rbtree_node_base* pNodeTemp = pNode->mpNodeLeft;

            while(pNodeTemp->mpNodeRight)
                pNodeTemp = pNodeTemp->mpNodeRight;

            return pNodeTemp;
        }

        rbtree_node_base* pNodeTemp = pNode->mpNodeParent;

        while(pNode == pNodeTemp->mpNodeLeft) 
        {
            pNode     = pNodeTemp;
            pNodeTemp = pNodeTemp->mpNodeParent;
        }

        return const_cast<rbtree_node_base*>(pNodeTemp);
    }